

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schedule.hpp
# Opt level: O0

bool __thiscall Comparator::operator()(Comparator *this,ScheduleHandle *s1,ScheduleHandle *s2)

{
  element_type *peVar1;
  double dVar2;
  double dVar3;
  tuple<unsigned_long&,unsigned_long&> local_88 [16];
  pair<unsigned_long,_unsigned_long> local_78;
  tuple<unsigned_long&,unsigned_long&> local_68 [16];
  pair<unsigned_long,_unsigned_long> local_58;
  ulong local_48;
  uint64_t s2_total_time;
  uint64_t s1_total_time;
  size_t s2_peak_memory;
  size_t s1_peak_memory;
  ScheduleHandle *s2_local;
  ScheduleHandle *s1_local;
  Comparator *this_local;
  
  s1_peak_memory = (size_t)s2;
  s2_local = s1;
  s1_local = (ScheduleHandle *)this;
  peVar1 = std::__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)s1)
  ;
  local_58 = Schedule::analyze(peVar1);
  std::tie<unsigned_long,unsigned_long>((unsigned_long *)local_68,&s2_peak_memory);
  std::tuple<unsigned_long&,unsigned_long&>::operator=(local_68,&local_58);
  peVar1 = std::__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      s1_peak_memory);
  local_78 = Schedule::analyze(peVar1);
  std::tie<unsigned_long,unsigned_long>((unsigned_long *)local_88,&s1_total_time);
  std::tuple<unsigned_long&,unsigned_long&>::operator=(local_88,&local_78);
  if (s2_peak_memory <= this->limit == s1_total_time <= this->limit) {
    if (this->limit < s2_peak_memory) {
      dVar2 = score(this,s2_local);
      dVar3 = score(this,(ScheduleHandle *)s1_peak_memory);
      this_local._7_1_ = dVar3 < dVar2;
    }
    else {
      this_local._7_1_ = local_48 < s2_total_time;
    }
  }
  else {
    this_local._7_1_ = s1_total_time <= this->limit;
  }
  return this_local._7_1_;
}

Assistant:

bool operator () (const ScheduleHandle &s1, const ScheduleHandle &s2) const {
        // Whether reaching limit
        size_t s1_peak_memory, s2_peak_memory;
        uint64_t s1_total_time, s2_total_time;
        std::tie(s1_peak_memory, s1_total_time) = s1->analyze();
        std::tie(s2_peak_memory, s2_total_time) = s2->analyze();
        if ((s1_peak_memory <= limit) != (s2_peak_memory <= limit)) {
            return s2_peak_memory <= limit;
        } else if (s1_peak_memory <= limit) {
            return s1_total_time > s2_total_time;
        }

        // Compare both time and memory
        return score(s1) > score(s2);
    }